

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParamConstraint.hpp
# Opt level: O2

void __thiscall
OpenMD::GreaterThanConstraint<double>::GreaterThanConstraint
          (GreaterThanConstraint<double> *this,double rhs)

{
  stringstream iss;
  string local_1b8 [32];
  stringstream local_198 [16];
  ostream local_188 [376];
  
  (this->super_ParamConstraintFacade<OpenMD::GreaterThanConstraint<double>_>).description_.
  _M_dataplus._M_p =
       (pointer)&(this->super_ParamConstraintFacade<OpenMD::GreaterThanConstraint<double>_>).
                 description_.field_2;
  (this->super_ParamConstraintFacade<OpenMD::GreaterThanConstraint<double>_>).description_.
  _M_string_length = 0;
  (this->super_ParamConstraintFacade<OpenMD::GreaterThanConstraint<double>_>).description_.field_2.
  _M_local_buf[0] = '\0';
  this->rhs_ = rhs;
  std::__cxx11::stringstream::stringstream(local_198);
  std::operator<<(local_188,"greater than");
  std::ostream::_M_insert<double>(rhs);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)this,local_1b8);
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

GreaterThanConstraint(T rhs) : rhs_(rhs) {
      std::stringstream iss;
      iss << "greater than" << rhs;
      this->description_ = iss.str();
    }